

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_aggsig_verify_single
              (secp256k1_context *ctx,uchar *sig64,uchar *msg32,secp256k1_pubkey *pubnonce,
              secp256k1_pubkey *pubkey,secp256k1_pubkey *pubkey_total,secp256k1_pubkey *extra_pubkey
              ,int is_partial)

{
  int iVar1;
  secp256k1_scratch_space *cbdata_00;
  long in_RCX;
  long in_RDX;
  uchar *in_RSI;
  secp256k1_ecmult_context *in_RDI;
  long in_R8;
  long in_stack_00000008;
  int in_stack_00000010;
  int return_check;
  int overflow;
  secp256k1_pubkey tmp_pk;
  secp256k1_ge tmp_ge;
  secp256k1_verify_callback_data cbdata;
  secp256k1_scratch_space *scratch;
  secp256k1_scalar sighash;
  secp256k1_ge pk_sum_ge;
  secp256k1_gej pk_sum;
  secp256k1_fe r_x;
  secp256k1_scalar g_sc;
  char *in_stack_fffffffffffffd78;
  secp256k1_ge *a;
  secp256k1_context *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  bool bVar2;
  undefined4 uVar3;
  int in_stack_fffffffffffffd94;
  secp256k1_gej *in_stack_fffffffffffffd98;
  secp256k1_fe *in_stack_fffffffffffffda0;
  secp256k1_ge *in_stack_fffffffffffffdb8;
  secp256k1_ge *in_stack_fffffffffffffdc0;
  secp256k1_context *in_stack_fffffffffffffdc8;
  secp256k1_ge *in_stack_fffffffffffffdd0;
  secp256k1_fe *in_stack_fffffffffffffde8;
  secp256k1_ge *in_stack_fffffffffffffdf0;
  uchar *in_stack_fffffffffffffe40;
  secp256k1_pubkey *in_stack_fffffffffffffe48;
  secp256k1_pubkey *in_stack_fffffffffffffe50;
  secp256k1_scalar *in_stack_fffffffffffffe58;
  secp256k1_context *in_stack_fffffffffffffe60;
  secp256k1_ecmult_multi_callback *in_stack_fffffffffffffe88;
  secp256k1_scalar *in_stack_fffffffffffffe90;
  secp256k1_gej *in_stack_fffffffffffffe98;
  secp256k1_scratch *in_stack_fffffffffffffea0;
  secp256k1_ecmult_context *in_stack_fffffffffffffea8;
  size_t in_stack_fffffffffffffec0;
  secp256k1_ge *in_stack_ffffffffffffff90;
  secp256k1_gej *in_stack_ffffffffffffff98;
  secp256k1_gej *in_stack_ffffffffffffffa0;
  uint local_4;
  
  uVar3 = 0;
  iVar1 = secp256k1_ecmult_context_is_built(in_RDI);
  if (iVar1 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_4 = 0;
  }
  else if (in_RSI == (uchar *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_4 = 0;
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    local_4 = 0;
  }
  else {
    iVar1 = secp256k1_fe_set_b32((secp256k1_fe *)&stack0xffffffffffffff80,in_RSI);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      secp256k1_scalar_set_b32
                ((secp256k1_scalar *)CONCAT44(in_stack_fffffffffffffd94,uVar3),
                 (uchar *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
                 (int *)in_stack_fffffffffffffd80);
      if (in_stack_fffffffffffffd94 == 0) {
        if (in_RCX == 0) {
          secp256k1_ge_set_xquad(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
          secp256k1_pubkey_save
                    ((secp256k1_pubkey *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
          secp256k1_compute_sighash_single
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        }
        else {
          secp256k1_compute_sighash_single
                    (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                     in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        }
        cbdata_00 = secp256k1_scratch_space_create
                              (in_stack_fffffffffffffd80,(size_t)in_stack_fffffffffffffd78);
        if (cbdata_00 == (secp256k1_scratch_space *)0x0) {
          local_4 = 0;
        }
        else {
          a = (secp256k1_ge *)0x1;
          iVar1 = secp256k1_ecmult_multi_var
                            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                             in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                             in_stack_fffffffffffffe88,cbdata_00,in_stack_fffffffffffffec0);
          if (iVar1 == 0) {
            secp256k1_scratch_space_destroy((secp256k1_scratch_space *)0x118554);
            local_4 = 0;
          }
          else {
            secp256k1_scratch_space_destroy((secp256k1_scratch_space *)0x118571);
            if (in_stack_00000008 != 0) {
              secp256k1_pubkey_load
                        (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                         (secp256k1_pubkey *)in_stack_fffffffffffffdb8);
              secp256k1_ge_neg((secp256k1_ge *)in_stack_fffffffffffffd80,a);
              secp256k1_gej_add_ge
                        (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                         in_stack_ffffffffffffff90);
            }
            secp256k1_ge_set_gej
                      (in_stack_fffffffffffffdd0,(secp256k1_gej *)in_stack_fffffffffffffdc8);
            local_4 = secp256k1_fe_equal_var
                                (in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->x);
            if (in_stack_00000010 == 0) {
              bVar2 = false;
              if (local_4 != 0) {
                iVar1 = secp256k1_gej_has_quad_y_var(in_stack_fffffffffffffd98);
                bVar2 = iVar1 != 0;
              }
              local_4 = (uint)bVar2;
            }
          }
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int secp256k1_aggsig_verify_single(
    const secp256k1_context* ctx,
    const unsigned char *sig64,
    const unsigned char *msg32,
    const secp256k1_pubkey *pubnonce,
    const secp256k1_pubkey *pubkey,
    const secp256k1_pubkey *pubkey_total,
    const secp256k1_pubkey *extra_pubkey,
    const int is_partial){

    secp256k1_scalar g_sc;
    secp256k1_fe r_x;
    secp256k1_gej pk_sum;
    secp256k1_ge pk_sum_ge;
    secp256k1_scalar sighash;
    secp256k1_scratch_space *scratch;
    secp256k1_verify_callback_data cbdata;
    secp256k1_ge tmp_ge;
    secp256k1_pubkey tmp_pk;

    int overflow;
    int return_check=0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(pubkey != NULL);

    /* extract R */
    if (!secp256k1_fe_set_b32(&r_x, sig64)) {
        return 0;
    }

    /* extract s */
    secp256k1_scalar_set_b32(&g_sc, sig64 + 32, &overflow);
    if (overflow) {
        return 0;
    }

    /* compute e = sighash */
    if (pubnonce != NULL) {
        secp256k1_compute_sighash_single(ctx, &sighash, pubnonce, pubkey_total, msg32);
    } else {
        secp256k1_ge_set_xquad(&tmp_ge, &r_x);
        secp256k1_pubkey_save(&tmp_pk, &tmp_ge);
        secp256k1_compute_sighash_single(ctx, &sighash, &tmp_pk, pubkey_total, msg32);
    }

    /* Populate callback data */
    cbdata.ctx = ctx;
    cbdata.pubkeys = pubkey;
    cbdata.single_hash = sighash;

    scratch = secp256k1_scratch_space_create(ctx, 1024*4096);
    if (scratch == NULL){
        return 0;
    }
    
    /* Compute sG - eP, which should be R */
    if (!secp256k1_ecmult_multi_var(&ctx->ecmult_ctx, scratch, &pk_sum, &g_sc, secp256k1_aggsig_verify_callback_single, &cbdata, 1)) {
        secp256k1_scratch_space_destroy(scratch);
        return 0;
    }

    secp256k1_scratch_space_destroy(scratch);

    if (extra_pubkey != NULL) {
        /* Subtract an extra public key */
        secp256k1_pubkey_load(ctx, &tmp_ge, extra_pubkey);
        secp256k1_ge_neg(&tmp_ge, &tmp_ge);
        secp256k1_gej_add_ge(&pk_sum, &pk_sum, &tmp_ge);
    }

    secp256k1_ge_set_gej(&pk_sum_ge, &pk_sum);

    return_check = secp256k1_fe_equal_var(&r_x, &pk_sum_ge.x);
    if (!is_partial){
        return return_check && secp256k1_gej_has_quad_y_var(&pk_sum);
    } else {
        return return_check;
    }

}